

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

void xml_print_ns(lyout *out,lyd_node *node,int options)

{
  lys_module **pplVar1;
  lys_module **pplVar2;
  LYS_NODE LVar3;
  mlist *__ptr;
  int iVar4;
  lys_module *plVar5;
  int r;
  mlist *miter;
  mlist *mlist;
  lys_module *wdmod;
  lyd_attr *attr;
  lyd_node *node2;
  lyd_node *cur;
  lyd_node *next;
  lyd_node *plStack_18;
  int options_local;
  lyd_node *node_local;
  lyout *out_local;
  
  mlist = (mlist *)0x0;
  miter = (mlist *)0x0;
  next._4_4_ = options;
  plStack_18 = node;
  node_local = (lyd_node *)out;
  if (out == (lyout *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_xml.c"
                  ,0x48,"void xml_print_ns(struct lyout *, const struct lyd_node *, int)");
  }
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_xml.c"
                  ,0x49,"void xml_print_ns(struct lyout *, const struct lyd_node *, int)");
  }
  for (wdmod = (lys_module *)node->attr; wdmod != (lys_module *)0x0;
      wdmod = (lys_module *)wdmod->name) {
    iVar4 = strcmp(plStack_18->schema->name,"filter");
    if ((iVar4 != 0) ||
       ((iVar4 = strcmp(plStack_18->schema->module->name,"ietf-netconf"), iVar4 != 0 &&
        (iVar4 = strcmp(plStack_18->schema->module->name,"notifications"), iVar4 != 0)))) {
      plVar5 = lys_main_module(*(lys_module **)(wdmod->prefix + 0x30));
      iVar4 = modlist_add(&miter,plVar5);
      if (iVar4 != 0) goto LAB_001dda7b;
    }
  }
  LVar3 = plStack_18->schema->nodetype;
  if (LVar3 != LYS_CONTAINER) {
    if ((LVar3 == LYS_LEAF) || (LVar3 == LYS_LEAFLIST)) {
      if (((plStack_18->field_0x9 & 1) != 0) &&
         (((next._4_4_ & 0xc0) != 0 &&
          (mlist = (mlist *)ly_ctx_get_module(plStack_18->schema->module->ctx,
                                              "ietf-netconf-with-defaults",(char *)0x0,1),
          (lys_module *)mlist != (lys_module *)0x0)))) {
        modlist_add(&miter,(lys_module *)mlist);
      }
      goto LAB_001dda7b;
    }
    if ((((LVar3 != LYS_LIST) && (LVar3 != LYS_NOTIF)) && (LVar3 != LYS_RPC)) &&
       (LVar3 != LYS_ACTION)) goto LAB_001dda7b;
  }
  if ((((next._4_4_ & 0xc0) == 0) ||
      (mlist = (mlist *)ly_ctx_get_module(plStack_18->schema->module->ctx,
                                          "ietf-netconf-with-defaults",(char *)0x0,1),
      (lys_module *)mlist == (lys_module *)0x0)) ||
     (iVar4 = modlist_add(&miter,(lys_module *)mlist), iVar4 == 0)) {
    for (attr = (lyd_attr *)plStack_18->child; attr != (lyd_attr *)0x0;
        attr = (lyd_attr *)attr->name) {
      cur = (lyd_node *)attr;
      while (node2 = cur, cur != (lyd_node *)0x0) {
        for (wdmod = (lys_module *)cur->attr; wdmod != (lys_module *)0x0;
            wdmod = (lys_module *)wdmod->name) {
          iVar4 = strcmp(node2->schema->name,"filter");
          if ((iVar4 != 0) ||
             ((iVar4 = strcmp(node2->schema->module->name,"ietf-netconf"), iVar4 != 0 &&
              (iVar4 = strcmp(node2->schema->module->name,"notifications"), iVar4 != 0)))) {
            plVar5 = lys_main_module(*(lys_module **)(wdmod->prefix + 0x30));
            iVar4 = modlist_add(&miter,plVar5);
            if (iVar4 != 0) goto LAB_001dda7b;
          }
        }
        if ((node2->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          cur = node2->child;
        }
        else {
          cur = (lyd_node *)0x0;
        }
        if (cur == (lyd_node *)0x0) {
          if (node2 == (lyd_node *)attr) break;
          cur = node2->next;
        }
        while ((cur == (lyd_node *)0x0 &&
               (node2 = node2->parent, node2->parent != (lyd_node *)(attr->value).binary))) {
          cur = node2->next;
        }
      }
    }
  }
LAB_001dda7b:
  while (__ptr = miter, miter != (mlist *)0x0) {
    pplVar1 = &miter->module;
    pplVar2 = &miter->module;
    miter = miter->next;
    ly_print((lyout *)node_local," xmlns:%s=\"%s\"",(*pplVar1)->prefix,(*pplVar2)->ns);
    free(__ptr);
  }
  return;
}

Assistant:

static void
xml_print_ns(struct lyout *out, const struct lyd_node *node, int options)
{
    struct lyd_node *next, *cur, *node2;
    struct lyd_attr *attr;
    const struct lys_module *wdmod = NULL;
    struct mlist *mlist = NULL, *miter;
    int r;

    assert(out);
    assert(node);

    /* add node attribute modules */
    for (attr = node->attr; attr; attr = attr->next) {
        if (!strcmp(node->schema->name, "filter") &&
                (!strcmp(node->schema->module->name, "ietf-netconf") ||
                 !strcmp(node->schema->module->name, "notifications"))) {
            /* exception for NETCONF's filter attributes */
            continue;
        } else {
            r = modlist_add(&mlist, lys_main_module(attr->annotation->module));
        }
        if (r) {
            goto print;
        }
    }

    /* add node children nodes and attribute modules */
    switch (node->schema->nodetype) {
    case LYS_LEAFLIST:
    case LYS_LEAF:
        if (node->dflt && (options & (LYP_WD_ALL_TAG | LYP_WD_IMPL_TAG))) {
            /* get with-defaults module and print its namespace */
            wdmod = ly_ctx_get_module(node->schema->module->ctx, "ietf-netconf-with-defaults", NULL, 1);
            if (wdmod && modlist_add(&mlist, wdmod)) {
                goto print;
            }
        }
        break;
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_NOTIF:
        if (options & (LYP_WD_ALL_TAG | LYP_WD_IMPL_TAG)) {
            /* get with-defaults module and print its namespace */
            wdmod = ly_ctx_get_module(node->schema->module->ctx, "ietf-netconf-with-defaults", NULL, 1);
            if (wdmod && modlist_add(&mlist, wdmod)) {
                goto print;
            }
        }

        LY_TREE_FOR(node->child, node2) {
            LY_TREE_DFS_BEGIN(node2, next, cur) {
                for (attr = cur->attr; attr; attr = attr->next) {
                    if (!strcmp(cur->schema->name, "filter") &&
                            (!strcmp(cur->schema->module->name, "ietf-netconf") ||
                             !strcmp(cur->schema->module->name, "notifications"))) {
                        /* exception for NETCONF's filter attributes */
                        continue;
                    } else {
                        r = modlist_add(&mlist, lys_main_module(attr->annotation->module));
                    }
                    if (r) {
                        goto print;
                    }
                }
            LY_TREE_DFS_END(node2, next, cur)}
        }
        break;
    default:
        break;
    }

print:
    /* print used namespaces */
    while (mlist) {
        miter = mlist;
        mlist = mlist->next;

        ly_print(out, " xmlns:%s=\"%s\"", miter->module->prefix, miter->module->ns);
        free(miter);
    }
}